

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_failprob.c
# Opt level: O1

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  uint __seed;
  int nTest;
  int K;
  time_t tVar3;
  
  __seed = 0;
  nTest = 500;
  K = 100;
  do {
    while( true ) {
      iVar2 = getopt(argc,argv,"hk:i:s:");
      if (iVar2 < 0x69) break;
      if (iVar2 == 0x69) {
        nTest = atoi(_optarg);
      }
      else if (iVar2 == 0x6b) {
        K = atoi(_optarg);
      }
      else if (iVar2 == 0x73) {
        __seed = atoi(_optarg);
      }
    }
    if (iVar2 == -1) {
      if ((int)__seed < 0) {
        tVar3 = time((time_t *)0x0);
        __seed = (uint)tVar3;
      }
      srand(__seed);
      _Var1 = test_fprob(K,nTest);
      return (int)!_Var1;
    }
    if (iVar2 == 0x3f) {
      exit(1);
    }
  } while (iVar2 != 0x68);
  usage();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
	int K = 100;
	int nIter = 500;
	int seed = 0;

	/* scan command lines */
	int c;
	while ((c = getopt(argc, argv, "hk:i:s:")) != -1) {
		switch (c) {
		case 'h':
			usage();
			exit(EXIT_SUCCESS);
		case 'k':
			K = atoi(optarg);
			break;
		case 'i':
			nIter = atoi(optarg);
			break;
		case 's':
			seed = atoi(optarg);
			break;
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	/* Run tests */
	srand(seed < 0 ? time(0) : seed);
	if (!test_fprob(K, nIter))
		return EXIT_FAILURE;

	return EXIT_SUCCESS;
}